

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O0

void __thiscall
QPainter::drawTiledPixmap(QPainter *this,int x,int y,int w,int h,QPixmap *pm,int sx,int sy)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QRectF *in_RDI;
  int in_R8D;
  QPointF *in_R9;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int in_stack_00000010;
  QPointF local_38;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QRectF::QRectF(&local_28,(double)in_ESI,(double)in_EDX,(double)in_ECX,(double)in_R8D);
  QPointF::QPointF(&local_38,(double)in_stack_00000008,(double)in_stack_00000010);
  QPainter::drawTiledPixmap(in_RDI,(QPixmap *)&local_28,in_R9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::drawTiledPixmap(int x, int y, int w, int h, const QPixmap &pm, int sx, int sy)
{
    drawTiledPixmap(QRectF(x, y, w, h), pm, QPointF(sx, sy));
}